

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_general.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  TestMaterial universe;
  TestMaterial clone_universe;
  TestMaterial local_140;
  TestMaterial local_b0;
  
  sch::CD_Scene::CD_Scene(&local_140.sObj);
  local_140.CurrentObj = 0;
  local_140.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.nonSTPBV_ = true;
  TestMaterial::initializeUniverse(&local_140);
  TestMaterial::GeneralTest(&local_140);
  sch::CD_Scene::CD_Scene(&local_b0.sObj);
  local_b0.CurrentObj = 0;
  local_b0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.nonSTPBV_ = true;
  if (local_140._16_8_ != local_140._8_8_) {
    uVar1 = 0;
    do {
      (**(code **)(**(long **)(local_140._8_8_ + uVar1 * 8) + 8))();
      sch::CD_Scene::addObject((S_Object *)&local_b0);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(local_140._16_8_ - local_140._8_8_) >> 3));
  }
  TestMaterial::GeneralTest(&local_b0);
  std::vector<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>::~vector(&local_b0.stppObjects);
  sch::CD_Scene::~CD_Scene(&local_b0.sObj);
  std::vector<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>::~vector(&local_140.stppObjects);
  sch::CD_Scene::~CD_Scene(&local_140.sObj);
  return 0;
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  TestMaterial universe = TestMaterial(NON_STP_BV_OBJECTS);
  universe.initializeUniverse();
  universe.GeneralTest();
  {
    TestMaterial clone_universe(NON_STP_BV_OBJECTS);
    CloneUniverse(universe, clone_universe);
    clone_universe.GeneralTest();
  }
  return 0;
}